

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall capnp::JsonCodec::handleByAnnotation(JsonCodec *this,Schema schema)

{
  short sVar1;
  Impl *pIVar2;
  Entry *pEVar3;
  undefined8 uVar4;
  StructSchema SVar5;
  size_t params;
  RawBrandedSchema *pRVar6;
  ArrayPtr<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry> table;
  EnumSchema enumSchema;
  Vector<capnp::Schema> dependencies;
  Schema local_c8;
  anon_union_8_2_eba6ea51_for_Type_5 local_c0;
  undefined1 local_b8 [24];
  AnnotatedEnumHandler *pAStack_a0;
  uint local_98;
  Own<capnp::JsonCodec::AnnotatedEnumHandler> local_88;
  Maybe<kj::StringPtr> local_70;
  Maybe<capnp::json::DiscriminatorOptions::Reader> local_58;
  
  local_c8.raw = schema.raw;
  Schema::getProto((Reader *)local_b8,&local_c8);
  if (0x6f < local_98) {
    sVar1 = *(short *)((long)&((Disposer *)(local_b8._16_8_ + 8))->_vptr_Disposer + 4);
    if (sVar1 == 2) {
      local_c0 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asEnum(&local_c8);
      pIVar2 = (this->impl).ptr;
      pEVar3 = (pIVar2->annotatedEnumHandlers).table.rows.builder.ptr;
      params = (long)(pIVar2->annotatedEnumHandlers).table.rows.builder.pos - (long)pEVar3 >> 5;
      table.size_ = (size_t)pEVar3;
      table.ptr = (Entry *)&(pIVar2->annotatedEnumHandlers).table.indexes;
      kj::
      HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>
      ::
      insert<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Entry,capnp::EnumSchema&>
                ((HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>
                  *)local_b8,table,params,(EnumSchema *)params);
      if (local_b8[0] ==
          (HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>
           )0x0) {
        kj::heap<capnp::JsonCodec::AnnotatedEnumHandler,capnp::EnumSchema&>
                  ((kj *)&local_88,(EnumSchema *)&local_c0);
        addTypeHandler(this,(EnumSchema)local_c0,
                       &(local_88.ptr)->super_Handler<capnp::DynamicEnum,_(capnp::Style)0>);
        local_b8._0_3_ = 0xf;
        local_b8._8_8_ = local_c0;
        local_b8._16_8_ = local_88.disposer;
        pAStack_a0 = local_88.ptr;
        local_88.ptr = (AnnotatedEnumHandler *)0x0;
        kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>::dispose(&local_88);
        kj::Vector<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Entry>
        ::add<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Entry>
                  ((Vector<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Entry>
                    *)&pIVar2->annotatedEnumHandlers,(Entry *)local_b8);
        kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>::dispose
                  ((Own<capnp::JsonCodec::AnnotatedEnumHandler> *)(local_b8 + 0x10));
      }
    }
    else if (sVar1 == 1) {
      Schema::getProto((Reader *)local_b8,&local_c8);
      if ((local_98 < 0x40) || (*(_func_int ***)local_b8._16_8_ != (_func_int **)0xa3fa7845f919dd83)
         ) {
        local_b8._0_8_ = (RawBrandedSchema *)0x0;
        local_b8._8_8_ = (RawBrandedSchema *)0x0;
        local_b8._16_8_ = (Disposer *)0x0;
        SVar5 = Schema::asStruct(&local_c8);
        local_58.ptr.isSet = false;
        local_70.ptr.isSet = false;
        loadAnnotatedHandler(this,SVar5,&local_58,&local_70,(Vector<capnp::Schema> *)local_b8);
        uVar4 = local_b8._8_8_;
        for (pRVar6 = (RawBrandedSchema *)local_b8._0_8_; pRVar6 != (RawBrandedSchema *)uVar4;
            pRVar6 = (RawBrandedSchema *)&pRVar6->scopes) {
          handleByAnnotation(this,(RawBrandedSchema *)pRVar6->generic);
        }
        kj::ArrayBuilder<capnp::Schema>::dispose((ArrayBuilder<capnp::Schema> *)local_b8);
      }
      else {
        SVar5 = Schema::asStruct(&local_c8);
        addTypeHandler(this,SVar5,
                       &handleByAnnotation::GLOBAL_HANDLER.
                        super_Handler<capnp::DynamicStruct,_(capnp::Style)2>);
      }
    }
  }
  return;
}

Assistant:

void JsonCodec::handleByAnnotation(Schema schema) {
  switch (schema.getProto().which()) {
    case schema::Node::STRUCT: {
      if (schema.getProto().getId() == capnp::typeId<JsonValue>()) {
        // Special handler for JsonValue.
        static JsonValueHandler GLOBAL_HANDLER;
        addTypeHandler(schema.asStruct(), GLOBAL_HANDLER);
      } else {
        kj::Vector<Schema> dependencies;
        loadAnnotatedHandler(schema.asStruct(), nullptr, nullptr, dependencies);
        for (auto dep: dependencies) {
          handleByAnnotation(dep);
        }
      }
      break;
    }
    case schema::Node::ENUM: {
      auto enumSchema = schema.asEnum();
      impl->annotatedEnumHandlers.findOrCreate(enumSchema, [&]() {
        auto handler = kj::heap<AnnotatedEnumHandler>(enumSchema);
        addTypeHandler(enumSchema, *handler);
        return kj::HashMap<Type, kj::Own<AnnotatedEnumHandler>>::Entry {
            enumSchema, kj::mv(handler) };
      });
      break;
    }
    default:
      break;
  }
}